

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.c
# Opt level: O2

LY_ERR lyplg_type_store_bits
                 (ly_ctx *ctx,lysc_type *type,void *value,size_t value_len,uint32_t options,
                 LY_VALUE_FORMAT format,void *UNUSED_prefix_data,uint32_t hints,
                 lysc_node *UNUSED_ctx_node,lyd_value *storage,lys_glob_unres *UNUSED_unres,
                 ly_err_item **err)

{
  byte *pbVar1;
  uint uVar2;
  lysc_type_bitenum_item *plVar3;
  LY_ERR LVar4;
  int iVar5;
  size_t sVar6;
  void *pvVar7;
  size_t sVar8;
  ushort **ppuVar9;
  long *plVar10;
  ulong uVar11;
  long lVar12;
  size_t sVar13;
  ulong uVar14;
  char *pcVar15;
  long lVar16;
  ulong uVar17;
  
  storage->_canonical = (char *)0x0;
  storage->realtype = (lysc_type *)0x0;
  *(undefined8 *)((long)&storage->field_2 + 0x10) = 0;
  (storage->field_2).dec64 = 0;
  *(undefined8 *)((long)&storage->field_2 + 8) = 0;
  storage->realtype = type;
  if (format == LY_VALUE_LYB) {
    sVar6 = lyplg_type_bits_bitmap_size((lysc_type_bits *)type);
    if (sVar6 == value_len) {
      if ((options & 1) == 0) {
        pvVar7 = malloc(value_len);
        (storage->field_2).dyn_mem = pvVar7;
        if (pvVar7 == (void *)0x0) {
          LVar4 = LY_EMEM;
          goto LAB_001ad79f;
        }
        memcpy(pvVar7,value,value_len);
      }
      else {
        (storage->field_2).dyn_mem = value;
        options = 0;
      }
      lVar16 = *(long *)((long)&storage->field_2 + 8);
      if (lVar16 == 0) {
        if (type[1].name == (char *)0x0) {
          sVar13 = 8;
        }
        else {
          sVar13 = *(long *)(type[1].name + -8) * 8 + 8;
        }
        plVar10 = (long *)calloc(1,sVar13);
        if (plVar10 == (long *)0x0) goto LAB_001ad736;
        lVar16 = 0;
      }
      else {
        if (type[1].name == (char *)0x0) {
          lVar12 = 0;
        }
        else {
          lVar12 = *(long *)(type[1].name + -8);
        }
        plVar10 = (long *)realloc((void *)(lVar16 + -8),(lVar12 + *(long *)(lVar16 + -8)) * 8 + 8);
        if (plVar10 == (long *)0x0) {
LAB_001ad736:
          LVar4 = LY_EMEM;
          ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyplg_type_store_bits");
          goto LAB_001ad79f;
        }
        lVar16 = *plVar10;
      }
      *(long **)((long)&storage->field_2 + 8) = plVar10 + 1;
      LVar4 = LY_SUCCESS;
      if (type[1].name == (char *)0x0) {
        sVar13 = 0;
      }
      else {
        sVar13 = *(long *)(type[1].name + -8) << 3;
      }
      memset(plVar10 + lVar16 + 1,0,sVar13);
      bits_bitmap2items((char *)(storage->field_2).enum_item,(lysc_type_bits *)type,
                        (lysc_type_bitenum_item **)(plVar10 + 1));
    }
    else {
      sVar6 = lyplg_type_bits_bitmap_size((lysc_type_bits *)type);
      LVar4 = ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,
                         "Invalid LYB bits value size %zu (expected %zu).",value_len,sVar6);
    }
  }
  else {
    LVar4 = lyplg_type_check_hints(hints,(char *)value,value_len,type->basetype,(int *)0x0,err);
    if (LVar4 == LY_SUCCESS) {
      sVar6 = lyplg_type_bits_bitmap_size((lysc_type_bits *)type);
      pvVar7 = malloc(sVar6);
      (storage->field_2).dyn_mem = pvVar7;
      if (pvVar7 != (void *)0x0) {
        sVar8 = lyplg_type_bits_bitmap_size((lysc_type_bits *)type);
        sVar6 = 0;
        memset(pvVar7,0,sVar8);
        plVar3 = (storage->field_2).enum_item;
        while (uVar14 = sVar6, sVar6 < value_len) {
          while( true ) {
            if (value_len == uVar14) goto LAB_001ad5ee;
            ppuVar9 = __ctype_b_loc();
            if ((*(byte *)((long)*ppuVar9 + (long)*(char *)((long)value + uVar14) * 2 + 1) & 0x20)
                == 0) break;
            uVar14 = uVar14 + 1;
          }
          sVar8 = uVar14;
          while ((sVar6 = value_len, value_len != sVar8 &&
                 (sVar6 = sVar8,
                 (*(byte *)((long)*ppuVar9 + (long)*(char *)((long)value + sVar8) * 2 + 1) & 0x20)
                 == 0))) {
            sVar8 = sVar8 + 1;
          }
          lVar16 = 0;
          uVar17 = 0;
          while( true ) {
            pcVar15 = type[1].name;
            if (pcVar15 == (char *)0x0) {
              uVar11 = 0;
            }
            else {
              uVar11 = *(ulong *)(pcVar15 + -8);
            }
            if (uVar11 <= uVar17) {
              LVar4 = ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,
                                 "Invalid bit \"%.*s\".",(ulong)(uint)((int)sVar6 - (int)uVar14),
                                 (char *)((long)value + uVar14));
              goto LAB_001ad5da;
            }
            iVar5 = ly_strncmp(*(char **)(pcVar15 + lVar16),(char *)((long)value + uVar14),
                               sVar6 - uVar14);
            if (iVar5 == 0) break;
            uVar17 = uVar17 + 1;
            lVar16 = lVar16 + 0x28;
          }
          lyplg_type_bits_bitmap_size((lysc_type_bits *)type);
          uVar2 = *(uint *)(type[1].name + lVar16 + 0x20);
          if (((0x1000000 << ((byte)uVar2 & 7)) >> 0x18 &
              (int)*(char *)((long)&plVar3->name + (ulong)(uVar2 >> 3))) != 0) {
            LVar4 = ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,
                               "Duplicate bit \"%s\".",*(undefined8 *)(type[1].name + lVar16));
LAB_001ad5da:
            if (LVar4 != LY_SUCCESS) goto LAB_001ad79f;
            break;
          }
          lyplg_type_bits_bitmap_size((lysc_type_bits *)type);
          pbVar1 = (byte *)((long)&plVar3->name +
                           (ulong)(*(uint *)(type[1].name + lVar16 + 0x20) >> 3));
          *pbVar1 = *pbVar1 | (byte)(1 << ((byte)*(uint *)(type[1].name + lVar16 + 0x20) & 7));
        }
LAB_001ad5ee:
        lVar16 = *(long *)((long)&storage->field_2 + 8);
        if (lVar16 == 0) {
          if (type[1].name == (char *)0x0) {
            sVar13 = 8;
          }
          else {
            sVar13 = *(long *)(type[1].name + -8) * 8 + 8;
          }
          plVar10 = (long *)calloc(1,sVar13);
          if (plVar10 != (long *)0x0) {
            lVar16 = 0;
            goto LAB_001ad6f8;
          }
        }
        else {
          if (type[1].name == (char *)0x0) {
            lVar12 = 0;
          }
          else {
            lVar12 = *(long *)(type[1].name + -8);
          }
          plVar10 = (long *)realloc((void *)(lVar16 + -8),(lVar12 + *(long *)(lVar16 + -8)) * 8 + 8)
          ;
          if (plVar10 != (long *)0x0) {
            lVar16 = *plVar10;
LAB_001ad6f8:
            *(long **)((long)&storage->field_2 + 8) = plVar10 + 1;
            LVar4 = LY_SUCCESS;
            if (type[1].name == (char *)0x0) {
              sVar13 = 0;
            }
            else {
              sVar13 = *(long *)(type[1].name + -8) << 3;
            }
            memset(plVar10 + lVar16 + 1,0,sVar13);
            bits_bitmap2items((char *)(storage->field_2).enum_item,(lysc_type_bits *)type,
                              (lysc_type_bitenum_item **)(plVar10 + 1));
            if (format == LY_VALUE_CANON) {
              if ((options & 1) != 0) {
                LVar4 = lydict_insert_zc(ctx,(char *)value,&storage->_canonical);
                goto LAB_001ad7ac;
              }
              pcVar15 = "";
              if (value_len != 0) {
                pcVar15 = (char *)value;
              }
              LVar4 = lydict_insert(ctx,pcVar15,value_len,&storage->_canonical);
            }
            goto LAB_001ad79f;
          }
        }
        goto LAB_001ad736;
      }
      LVar4 = LY_EMEM;
    }
  }
LAB_001ad79f:
  if ((options & 1) != 0) {
    free(value);
  }
LAB_001ad7ac:
  if (LVar4 != LY_SUCCESS) {
    lyplg_type_free_bits(ctx,storage);
  }
  return LVar4;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyplg_type_store_bits(const struct ly_ctx *ctx, const struct lysc_type *type, const void *value, size_t value_len,
        uint32_t options, LY_VALUE_FORMAT format, void *UNUSED(prefix_data), uint32_t hints,
        const struct lysc_node *UNUSED(ctx_node), struct lyd_value *storage, struct lys_glob_unres *UNUSED(unres),
        struct ly_err_item **err)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysc_type_bits *type_bits = (struct lysc_type_bits *)type;
    struct lyd_value_bits *val;

    /* init storage */
    memset(storage, 0, sizeof *storage);
    LYPLG_TYPE_VAL_INLINE_PREPARE(storage, val);
    LY_CHECK_ERR_GOTO(!val, ret = LY_EMEM, cleanup);
    storage->realtype = type;

    if (format == LY_VALUE_LYB) {
        /* validation */
        if (value_len != lyplg_type_bits_bitmap_size(type_bits)) {
            ret = ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL, "Invalid LYB bits value size %zu (expected %zu).",
                    value_len, lyplg_type_bits_bitmap_size(type_bits));
            goto cleanup;
        }

        /* store value (bitmap) */
        if (options & LYPLG_TYPE_STORE_DYNAMIC) {
            val->bitmap = (char *)value;
            options &= ~LYPLG_TYPE_STORE_DYNAMIC;
        } else {
            val->bitmap = malloc(value_len);
            LY_CHECK_ERR_GOTO(!val->bitmap, ret = LY_EMEM, cleanup);
            memcpy(val->bitmap, value, value_len);
        }

        /* allocate and fill the bit item array */
        LY_ARRAY_CREATE_GOTO(ctx, val->items, LY_ARRAY_COUNT(type_bits->bits), ret, cleanup);
        bits_bitmap2items(val->bitmap, type_bits, val->items);

        /* success */
        goto cleanup;
    }

    /* check hints */
    ret = lyplg_type_check_hints(hints, value, value_len, type->basetype, NULL, err);
    LY_CHECK_GOTO(ret, cleanup);

    /* allocate the bitmap */
    val->bitmap = malloc(lyplg_type_bits_bitmap_size(type_bits));
    LY_CHECK_ERR_GOTO(!val->bitmap, ret = LY_EMEM, cleanup);
    memset(val->bitmap, 0, lyplg_type_bits_bitmap_size(type_bits));

    /* fill the bitmap */
    ret = bits_str2bitmap(value, value_len, type_bits, val->bitmap, err);
    LY_CHECK_GOTO(ret, cleanup);

    /* allocate and fill the bit item array */
    LY_ARRAY_CREATE_GOTO(ctx, val->items, LY_ARRAY_COUNT(type_bits->bits), ret, cleanup);
    bits_bitmap2items(val->bitmap, type_bits, val->items);

    if (format == LY_VALUE_CANON) {
        /* store canonical value */
        if (options & LYPLG_TYPE_STORE_DYNAMIC) {
            ret = lydict_insert_zc(ctx, (char *)value, &storage->_canonical);
            options &= ~LYPLG_TYPE_STORE_DYNAMIC;
            LY_CHECK_GOTO(ret, cleanup);
        } else {
            ret = lydict_insert(ctx, value_len ? value : "", value_len, &storage->_canonical);
            LY_CHECK_GOTO(ret != LY_SUCCESS, cleanup);
        }
    }

cleanup:
    if (options & LYPLG_TYPE_STORE_DYNAMIC) {
        free((void *)value);
    }

    if (ret) {
        lyplg_type_free_bits(ctx, storage);
    }
    return ret;
}